

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

uint16_t TileData::rowBitplanes(Tile *tile,Palette *palette,uint32_t y)

{
  byte bVar1;
  byte bVar2;
  uint16_t color;
  Rgba RVar3;
  undefined8 in_RAX;
  uint32_t xOfs;
  uint16_t uVar4;
  undefined8 uStack_38;
  
  xOfs = 0;
  uVar4 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    if (xOfs == 8) {
      return uVar4;
    }
    RVar3 = Png::TilesVisitor::Tile::pixel(tile,xOfs,y);
    uStack_38 = CONCAT44(RVar3,(undefined4)uStack_38);
    color = Rgba::cgbColor((Rgba *)((long)&uStack_38 + 4));
    bVar1 = Palette::indexOf(palette,color);
    bVar2 = Palette::size(palette);
    if (bVar2 <= bVar1) break;
    uVar4 = (ushort)(bVar1 & 2) << 7 | (ushort)(bVar1 & 1) + uVar4 * 2;
    xOfs = xOfs + 1;
  }
  __assert_fail("index < palette.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                ,0x2a9,"rowBitplanes");
}

Assistant:

static uint16_t rowBitplanes(Png::TilesVisitor::Tile const &tile, Palette const &palette,
	                             uint32_t y) {
		uint16_t row = 0;
		for (uint32_t x = 0; x < 8; ++x) {
			row <<= 1;
			uint8_t index = palette.indexOf(tile.pixel(x, y).cgbColor());
			assert(index < palette.size()); // The color should be in the palette
			if (index & 1) {
				row |= 1;
			}
			if (index & 2) {
				row |= 0x100;
			}
		}
		return row;
	}